

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>
          (DescriptorBuilder *this,EnumValueDescriptor *enum_value,EnumValueDescriptorProto *proto)

{
  anon_unknown_24 *this_00;
  char *pcVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  anon_unknown_24 *paVar3;
  char *pcVar4;
  string_view name;
  string_view element_name;
  string error;
  EnumValueDescriptor *local_70;
  VoidPtr local_68;
  code *pcStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  LogMessageFatal local_38;
  
  local_50 = 0;
  local_48 = 0;
  this_00 = (anon_unknown_24 *)enum_value->all_names_->_M_string_length;
  local_70 = enum_value;
  local_58 = &local_48;
  if (this_00 == (anon_unknown_24 *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x23fa,"!name.empty()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
  }
  pcVar1 = (enum_value->all_names_->_M_dataplus)._M_p;
  paVar3 = (anon_unknown_24 *)0x0;
  pcVar4 = "should be UPPER_SNAKE_CASE";
  do {
    if ((*(ulong *)(&DAT_003f9930 + (ulong)((byte)pcVar1[(long)paVar3] >> 6) * 8) >>
         ((ulong)(byte)pcVar1[(long)paVar3] & 0x3f) & 1) == 0) goto LAB_001d7f10;
    paVar3 = paVar3 + 1;
  } while (this_00 != paVar3);
  if ((byte)(*pcVar1 + 0xbfU) < 0x1a) {
    name._M_str = "";
    name._M_len = (size_t)pcVar1;
    bVar2 = anon_unknown_24::ContainsBadUnderscores(this_00,name);
    if (!bVar2) {
      return;
    }
    pcVar4 = "contains style violating underscores";
  }
  else {
    pcVar4 = "should begin with an upper case letter";
  }
LAB_001d7f10:
  std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)pcVar4);
  local_38.super_LogMessage._0_8_ = &local_70;
  local_68.obj = &local_38;
  pcStack_60 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>(google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptorProto_const&)::__0,std::__cxx11::string>
  ;
  make_error.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>(google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptorProto_const&)::__0,std::__cxx11::string>
  ;
  make_error.ptr_.obj = local_68.obj;
  element_name._M_str = (enum_value->all_names_->_M_dataplus)._M_p;
  element_name._M_len = enum_value->all_names_->_M_string_length;
  local_38.super_LogMessage.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )&local_58;
  AddError(this,element_name,&proto->super_Message,NAME,make_error);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(
    const EnumValueDescriptor* enum_value,
    const EnumValueDescriptorProto& proto) {
  std::string error;
  if (!IsValidUpperSnakeCaseName(enum_value->name(), &error)) {
    AddError(enum_value->name(), proto, DescriptorPool::ErrorCollector::NAME,
             [&] {
               return absl::StrCat("Enum value name ", enum_value->name(), " ",
                                   error, kNamingStyleOptOutMessage);
             });
  }
}